

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall
pbrt::BinaryReader::copyBytes<pbrt::math::vec3i>(BinaryReader *this,vec3i *t,size_t numBytes)

{
  pointer puVar1;
  pointer puVar2;
  runtime_error *this_00;
  uchar *puVar3;
  size_t in_RDX;
  void *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  
  puVar1 = in_RDI[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
  if (puVar2 < puVar1 + in_RDX) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x15aa45);
  memcpy(in_RSI,puVar3 + (long)in_RDI[1].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,in_RDX);
  in_RDI[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       in_RDI[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + in_RDX;
  return;
}

Assistant:

inline void copyBytes(T *t, size_t numBytes)
    {
      if ((currentEntityOffset + numBytes) > currentEntityData.size())
        throw std::runtime_error("invalid read attempt by entity - not enough data in data block!");
      memcpy((void *)t,(void *)((char*)currentEntityData.data()+currentEntityOffset),numBytes);
      currentEntityOffset += numBytes;
    }